

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Gia_Man_t * Au_ManDeriveTest(Abc_Ntk_t *pRoot)

{
  abctime aVar1;
  abctime aVar2;
  Au_Man_t *p;
  Abc_Nam_t *pAVar3;
  abctime aVar4;
  Vec_Ptr_t *p_00;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vOrder;
  Au_Ntk_t *pAVar5;
  Gia_Man_t *pGVar6;
  abctime aVar7;
  abctime aVar8;
  abctime aVar9;
  Abc_Des_t *pAVar10;
  abctime time;
  abctime time_00;
  abctime time_01;
  int i;
  long local_50;
  
  aVar1 = Abc_Clock();
  aVar2 = Abc_Clock();
  pAVar10 = (Abc_Des_t *)&pRoot->pName;
  if (pRoot->pDesign != (Abc_Des_t *)0x0) {
    pAVar10 = pRoot->pDesign;
  }
  p = Au_ManAlloc(pAVar10->pName);
  pAVar3 = Abc_NamStart(100,0x10);
  p->pFuncs = pAVar3;
  aVar4 = Abc_Clock();
  local_50 = aVar4 - aVar2;
  p_00 = Abc_NtkCollectHie(pRoot);
  pAVar5 = (Au_Ntk_t *)0x0;
  for (i = 0; i < p_00->nSize; i = i + 1) {
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p_00,i);
    vOrder = Abc_NtkDfsBoxes(pNtk);
    aVar2 = Abc_Clock();
    pAVar5 = Au_NtkDerive(p,pNtk,vOrder);
    pNtk->iStep = pAVar5->Id;
    pNtk->pData = pAVar5;
    aVar4 = Abc_Clock();
    local_50 = (local_50 - aVar2) + aVar4;
    Vec_PtrFree(vOrder);
  }
  Vec_PtrFree(p_00);
  Au_ManReorderModels(p,pAVar5);
  Au_ManPrintStats(p);
  Au_ManCountThings(pAVar5->pMan);
  pAVar5 = Au_ManFindNtkP(p,"path_0_r_x_lhs");
  if (pAVar5 == (Au_Ntk_t *)0x0) {
    printf("Could not find module \"%s\".\n","path_0_r_x_lhs");
    pAVar5 = (Au_Ntk_t *)pRoot->pData;
  }
  aVar2 = Abc_Clock();
  pGVar6 = Au_NtkDeriveFlatGia(pAVar5);
  aVar4 = Abc_Clock();
  aVar7 = Abc_Clock();
  Au_ManDelete(p);
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  Abc_PrintTime(0x873866,(char *)(aVar9 - aVar1),time);
  Abc_PrintTime(0x873870,(char *)((local_50 - aVar7) + aVar8),time_00);
  Abc_PrintTime(0x87387a,(char *)(aVar4 - aVar2),time_01);
  return pGVar6;
}

Assistant:

Gia_Man_t * Au_ManDeriveTest( Abc_Ntk_t * pRoot )
{
    extern Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk );

//    char * pModelName = NULL;
    char * pModelName = "path_0_r_x_lhs";
    Gia_Man_t * pGia = NULL;
    Vec_Ptr_t * vOrder, * vModels;
    Abc_Ntk_t * pMod;
    Au_Man_t * pMan;
    Au_Ntk_t * pNtk = NULL;
    abctime clk1, clk2 = 0, clk3 = 0, clk = Abc_Clock();
    int i;

    clk1 = Abc_Clock();
    pMan = Au_ManAlloc( pRoot->pDesign ? pRoot->pDesign->pName : pRoot->pName );
    pMan->pFuncs = Abc_NamStart( 100, 16 );
    clk2 += Abc_Clock() - clk1;

    vModels = Abc_NtkCollectHie( pRoot );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pMod, i )
    {
        vOrder = Abc_NtkDfsBoxes( pMod );

        clk1 = Abc_Clock();
        pNtk = Au_NtkDerive( pMan, pMod, vOrder );
        pMod->iStep = pNtk->Id;
        pMod->pData = pNtk;
        clk2 += Abc_Clock() - clk1;

        Vec_PtrFree( vOrder );
    }
    Vec_PtrFree( vModels );
    // order models in topological order
    Au_ManReorderModels( pMan, pNtk );

    // print statistics
    Au_ManPrintStats( pMan );
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
    {
        pNtk = Au_ManFindNtkP( pMan, pModelName );
        if ( pNtk == NULL )
            printf( "Could not find module \"%s\".\n", pModelName );
    }
    if ( pNtk == NULL )
        pNtk = (Au_Ntk_t *)pRoot->pData;

  
//    if ( !Abc_NtkCheckRecursive(pRoot) )
    {
        clk1 = Abc_Clock();
        pGia = Au_NtkDeriveFlatGia( pNtk );
        clk3 = Abc_Clock() - clk1;
//        printf( "GIA objects max = %d.\n", pMan->nGiaObjMax );
    }

//    clk1 = Abc_Clock();
//    Au_NtkSuppSizeTest( (Au_Ntk_t *)pRoot->pData );
//    clk4 = Abc_Clock() - clk1;

    clk1 = Abc_Clock();
    Au_ManDelete( pMan );
    clk2 += Abc_Clock() - clk1;
    
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    Abc_PrintTime( 1, "Time new ", clk2 );
    Abc_PrintTime( 1, "Time GIA ", clk3 );
//    Abc_PrintTime( 1, "Time supp", clk4 );
    return pGia;
}